

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__bmp_parse_header(stbi__context *s,stbi__bmp_data *info)

{
  int iVar1;
  stbi_uc *psVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  stbi__uint32 sVar6;
  char *pcVar7;
  stbi_uc *psVar8;
  stbi_uc *psVar9;
  stbi_uc sVar10;
  long in_FS_OFFSET;
  
  psVar2 = s->img_buffer;
  psVar9 = s->img_buffer_end;
  if (psVar2 < psVar9) {
    psVar8 = psVar2 + 1;
    s->img_buffer = psVar8;
    sVar10 = *psVar2;
LAB_00112f14:
    if (sVar10 == 'B') {
      if (psVar8 < psVar9) {
        s->img_buffer = psVar8 + 1;
        sVar10 = *psVar8;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_00113099;
        psVar9 = s->buffer_start;
        iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
        if (iVar4 == 0) {
          s->read_from_callbacks = 0;
          psVar9 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar10 = '\0';
        }
        else {
          sVar10 = *psVar9;
          psVar9 = psVar9 + iVar4;
        }
        s->img_buffer_end = psVar9;
        s->img_buffer = s->buffer_start + 1;
      }
      if (sVar10 == 'M') {
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar3 = stbi__get16le(s);
        iVar4 = stbi__get16le(s);
        info->offset = iVar4 << 0x10 | uVar3;
        uVar3 = stbi__get16le(s);
        iVar4 = stbi__get16le(s);
        uVar3 = iVar4 << 0x10 | uVar3;
        info->hsz = uVar3;
        info->mr = 0;
        info->mg = 0;
        info->mb = 0;
        info->ma = 0;
        info->extra_read = 0xe;
        if ((int)uVar3 < 0x38) {
          if (uVar3 != 0xc) {
            if (uVar3 != 0x28) goto LAB_001130cc;
            goto LAB_0011300e;
          }
          sVar6 = stbi__get16le(s);
          s->img_x = sVar6;
          uVar5 = stbi__get16le(s);
        }
        else {
          if (((uVar3 != 0x38) && (uVar3 != 0x6c)) && (uVar3 != 0x7c)) {
LAB_001130cc:
            pcVar7 = "unknown BMP";
            goto LAB_001130a0;
          }
LAB_0011300e:
          uVar5 = stbi__get16le(s);
          iVar4 = stbi__get16le(s);
          s->img_x = iVar4 << 0x10 | uVar5;
          uVar5 = stbi__get16le(s);
          iVar4 = stbi__get16le(s);
          uVar5 = iVar4 << 0x10 | uVar5;
        }
        s->img_y = uVar5;
        iVar4 = stbi__get16le(s);
        if (iVar4 == 1) {
          iVar4 = stbi__get16le(s);
          info->bpp = iVar4;
          if (uVar3 == 0xc) {
            return (void *)0x1;
          }
          uVar5 = stbi__get16le(s);
          iVar4 = stbi__get16le(s);
          if ((iVar4 * 0x10000 - 1U) + uVar5 < 2) {
            pcVar7 = "BMP RLE";
            goto LAB_001130a0;
          }
          stbi__get16le(s);
          stbi__get16le(s);
          stbi__get16le(s);
          stbi__get16le(s);
          stbi__get16le(s);
          stbi__get16le(s);
          stbi__get16le(s);
          stbi__get16le(s);
          stbi__get16le(s);
          stbi__get16le(s);
          if ((int)uVar3 < 0x6c) {
            if (uVar3 != 0x28) {
              if (uVar3 != 0x38) goto LAB_0011328f;
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
            }
            iVar1 = info->bpp;
            if ((iVar1 != 0x20) && (iVar1 != 0x10)) {
              return (void *)0x1;
            }
            uVar5 = iVar4 * 0x10000 | uVar5;
            if (uVar5 == 3) {
              sVar6 = stbi__get32le(s);
              info->mr = sVar6;
              sVar6 = stbi__get32le(s);
              info->mg = sVar6;
              sVar6 = stbi__get32le(s);
              info->mb = sVar6;
              info->extra_read = info->extra_read + 0xc;
              if (info->mg != sVar6 || info->mr != info->mg) {
                return (void *)0x1;
              }
            }
            else if (uVar5 == 0) {
              if (iVar1 != 0x20) {
                info->mr = 0x7c00;
                info->mg = 0x3e0;
                info->mb = 0x1f;
                return (void *)0x1;
              }
              info->mr = 0xff0000;
              info->mg = 0xff00;
              info->mb = 0xff;
              info->ma = 0xff000000;
              info->all_a = 0;
              return (void *)0x1;
            }
          }
          else if ((uVar3 == 0x6c) || (uVar3 == 0x7c)) {
            sVar6 = stbi__get32le(s);
            info->mr = sVar6;
            sVar6 = stbi__get32le(s);
            info->mg = sVar6;
            sVar6 = stbi__get32le(s);
            info->mb = sVar6;
            sVar6 = stbi__get32le(s);
            info->ma = sVar6;
            stbi__get32le(s);
            iVar4 = 0xc;
            do {
              stbi__get16le(s);
              stbi__get16le(s);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
            if (uVar3 != 0x6c) {
              if (uVar3 != 0x7c) {
                return (void *)0x0;
              }
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              stbi__get32le(s);
              return (void *)0x1;
            }
            return (void *)0x1;
          }
        }
LAB_0011328f:
        pcVar7 = "bad BMP";
        goto LAB_001130a0;
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    psVar9 = s->buffer_start;
    iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
    if (iVar4 == 0) {
      s->read_from_callbacks = 0;
      psVar9 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar10 = '\0';
    }
    else {
      sVar10 = *psVar9;
      psVar9 = psVar9 + iVar4;
    }
    psVar8 = s->buffer_start + 1;
    s->img_buffer_end = psVar9;
    s->img_buffer = psVar8;
    goto LAB_00112f14;
  }
LAB_00113099:
  pcVar7 = "not BMP";
LAB_001130a0:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar7;
  return (void *)0x0;
}

Assistant:

static void *stbi__bmp_parse_header(stbi__context *s, stbi__bmp_data *info)
{
   int hsz;
   if (stbi__get8(s) != 'B' || stbi__get8(s) != 'M') return stbi__errpuc("not BMP", "Corrupt BMP");
   stbi__get32le(s); // discard filesize
   stbi__get16le(s); // discard reserved
   stbi__get16le(s); // discard reserved
   info->offset = stbi__get32le(s);
   info->hsz = hsz = stbi__get32le(s);
   info->mr = info->mg = info->mb = info->ma = 0;
   info->extra_read = 14;

   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108 && hsz != 124) return stbi__errpuc("unknown BMP", "BMP type not supported: unknown");
   if (hsz == 12) {
      s->img_x = stbi__get16le(s);
      s->img_y = stbi__get16le(s);
   } else {
      s->img_x = stbi__get32le(s);
      s->img_y = stbi__get32le(s);
   }
   if (stbi__get16le(s) != 1) return stbi__errpuc("bad BMP", "bad BMP");
   info->bpp = stbi__get16le(s);
   if (hsz != 12) {
      int compress = stbi__get32le(s);
      if (compress == 1 || compress == 2) return stbi__errpuc("BMP RLE", "BMP type not supported: RLE");
      stbi__get32le(s); // discard sizeof
      stbi__get32le(s); // discard hres
      stbi__get32le(s); // discard vres
      stbi__get32le(s); // discard colorsused
      stbi__get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
         }
         if (info->bpp == 16 || info->bpp == 32) {
            if (compress == 0) {
               if (info->bpp == 32) {
                  info->mr = 0xffu << 16;
                  info->mg = 0xffu <<  8;
                  info->mb = 0xffu <<  0;
                  info->ma = 0xffu << 24;
                  info->all_a = 0; // if all_a is 0 at end, then we loaded alpha channel but it was all 0
               } else {
                  info->mr = 31u << 10;
                  info->mg = 31u <<  5;
                  info->mb = 31u <<  0;
               }
            } else if (compress == 3) {
               info->mr = stbi__get32le(s);
               info->mg = stbi__get32le(s);
               info->mb = stbi__get32le(s);
               info->extra_read += 12;
               // not documented, but generated by photoshop and handled by mspaint
               if (info->mr == info->mg && info->mg == info->mb) {
                  // ?!?!?
                  return stbi__errpuc("bad BMP", "bad BMP");
               }
            } else
               return stbi__errpuc("bad BMP", "bad BMP");
         }
      } else {
         int i;
         if (hsz != 108 && hsz != 124)
            return stbi__errpuc("bad BMP", "bad BMP");
         info->mr = stbi__get32le(s);
         info->mg = stbi__get32le(s);
         info->mb = stbi__get32le(s);
         info->ma = stbi__get32le(s);
         stbi__get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            stbi__get32le(s); // discard color space parameters
         if (hsz == 124) {
            stbi__get32le(s); // discard rendering intent
            stbi__get32le(s); // discard offset of profile data
            stbi__get32le(s); // discard size of profile data
            stbi__get32le(s); // discard reserved
         }
      }
   }
   return (void *) 1;
}